

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
* vkt::sr::anon_unknown_0::generateCubeCaseIterations
            (vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             *__return_storage_ptr__,GatherType gatherType,TextureFormat *textureFormat,
            IVec2 *offsetRange)

{
  int *piVar1;
  ChannelOrder CVar2;
  pointer pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  pointer pGVar9;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  *extraout_RAX;
  uint uVar10;
  pointer pGVar11;
  ulong uVar12;
  int cubeFaceI;
  CubeFace CVar13;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  value_type local_70;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  local_48;
  
  generateBasic2DCaseIterations
            (&local_48,gatherType,(TextureFormat *)(ulong)textureFormat->order,offsetRange);
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar9 = (pointer)((long)local_48.
                           super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48.
                           super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2);
  uVar10 = (int)pGVar9 * 0x38e38e39;
  CVar13 = CUBEFACE_NEGATIVE_X;
  do {
    if (CVar13 == CUBEFACE_NEGATIVE_X) {
      uVar12 = (ulong)(uVar10 & 0x7fffffff);
      pGVar11 = local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)uVar10) {
        do {
          local_70.face = CUBEFACE_NEGATIVE_X;
          local_70.gatherArgs.componentNdx = -1;
          local_70.gatherArgs.offsets[2].m_data[0] = 0;
          local_70.gatherArgs.offsets[2].m_data[1] = 0;
          local_70.gatherArgs.offsets[3].m_data[0] = 0;
          local_70.gatherArgs.offsets[3].m_data[1] = 0;
          local_70.gatherArgs.offsets[0].m_data[0] = 0;
          local_70.gatherArgs.offsets[0].m_data[1] = 0;
          local_70.gatherArgs.offsets[1].m_data[0] = 0;
          local_70.gatherArgs.offsets[1].m_data[1] = 0;
          std::
          vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
          ::push_back(__return_storage_ptr__,&local_70);
          pGVar9 = (__return_storage_ptr__->
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pGVar9[-1].gatherArgs.offsets[3].m_data[1] = pGVar11->offsets[3].m_data[1];
          iVar4 = pGVar11->componentNdx;
          iVar5 = pGVar11->offsets[0].m_data[0];
          iVar6 = pGVar11->offsets[0].m_data[1];
          iVar7 = pGVar11->offsets[1].m_data[0];
          uVar8 = *(undefined8 *)(pGVar11->offsets[2].m_data + 1);
          *(undefined8 *)(pGVar9[-1].gatherArgs.offsets[1].m_data + 1) =
               *(undefined8 *)(pGVar11->offsets[1].m_data + 1);
          *(undefined8 *)(pGVar9[-1].gatherArgs.offsets[2].m_data + 1) = uVar8;
          pGVar9[-1].gatherArgs.componentNdx = iVar4;
          pGVar9[-1].gatherArgs.offsets[0].m_data[0] = iVar5;
          pGVar9[-1].gatherArgs.offsets[0].m_data[1] = iVar6;
          pGVar9[-1].gatherArgs.offsets[1].m_data[0] = iVar7;
          pGVar9[-1].face = CUBEFACE_NEGATIVE_X;
          uVar12 = uVar12 - 1;
          pGVar11 = pGVar11 + 1;
        } while (uVar12 != 0);
      }
    }
    else if (0 < (int)uVar10) {
      CVar2 = textureFormat->order;
      pGVar9 = (pointer)(ulong)CVar2;
      uVar12 = 0;
      pGVar11 = local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (((CVar2 == D) || (CVar2 == DS)) ||
           (pGVar11->componentNdx == (CVar13 & CUBEFACE_POSITIVE_Y))) {
          local_70.face = CUBEFACE_NEGATIVE_X;
          local_70.gatherArgs.componentNdx = -1;
          local_70.gatherArgs.offsets[2].m_data[0] = 0;
          local_70.gatherArgs.offsets[2].m_data[1] = 0;
          local_70.gatherArgs.offsets[3].m_data[0] = 0;
          local_70.gatherArgs.offsets[3].m_data[1] = 0;
          local_70.gatherArgs.offsets[0].m_data[0] = 0;
          local_70.gatherArgs.offsets[0].m_data[1] = 0;
          local_70.gatherArgs.offsets[1].m_data[0] = 0;
          local_70.gatherArgs.offsets[1].m_data[1] = 0;
          std::
          vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
          ::push_back(__return_storage_ptr__,&local_70);
          uVar12 = uVar12 & 0xffffffff;
          pGVar9 = (pointer)(uVar12 * 9);
          pGVar3 = (__return_storage_ptr__->
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pGVar3[-1].gatherArgs.offsets[3].m_data[1] =
               local_48.
               super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].offsets[3].m_data[1];
          pGVar11 = local_48.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar12;
          iVar4 = pGVar11->componentNdx;
          iVar5 = pGVar11->offsets[0].m_data[0];
          iVar6 = pGVar11->offsets[0].m_data[1];
          iVar7 = pGVar11->offsets[1].m_data[0];
          piVar1 = local_48.
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].offsets[1].m_data + 1;
          uVar8 = *(undefined8 *)(piVar1 + 2);
          *(undefined8 *)(pGVar3[-1].gatherArgs.offsets[1].m_data + 1) = *(undefined8 *)piVar1;
          *(undefined8 *)(pGVar3[-1].gatherArgs.offsets[2].m_data + 1) = uVar8;
          pGVar3[-1].gatherArgs.componentNdx = iVar4;
          pGVar3[-1].gatherArgs.offsets[0].m_data[0] = iVar5;
          pGVar3[-1].gatherArgs.offsets[0].m_data[1] = iVar6;
          pGVar3[-1].gatherArgs.offsets[1].m_data[0] = iVar7;
          pGVar3[-1].face = CVar13;
          break;
        }
        uVar12 = uVar12 + 1;
        pGVar11 = pGVar11 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar12);
    }
    CVar13 = CVar13 + CUBEFACE_POSITIVE_X;
    if (CVar13 == CUBEFACE_LAST) {
      if (local_48.
          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return (vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                *)pGVar9;
      }
      operator_delete(local_48.
                      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return extraout_RAX;
    }
  } while( true );
}

Assistant:

vector<GatherCubeArgs> generateCubeCaseIterations (GatherType gatherType, const tcu::TextureFormat& textureFormat, const IVec2& offsetRange)
{
	const vector<GatherArgs>	basicIterations = generateBasic2DCaseIterations(gatherType, textureFormat, offsetRange);
	vector<GatherCubeArgs>		iterations;

	for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
	{
		const tcu::CubeFace cubeFace = (tcu::CubeFace)cubeFaceI;

		// Don't duplicate all cases for all faces.
		if (cubeFaceI == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				iterations.push_back(GatherCubeArgs());
				iterations.back().gatherArgs = basicIterations[basicNdx];
				iterations.back().face = cubeFace;
			}
		}
		else
		{
			// For other faces than first, only test one component per face.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(textureFormat) || basicIterations[basicNdx].componentNdx == cubeFaceI % 4)
				{
					iterations.push_back(GatherCubeArgs());
					iterations.back().gatherArgs = basicIterations[basicNdx];
					iterations.back().face = cubeFace;
					break;
				}
			}
		}
	}

	return iterations;
}